

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O3

void test_img_ext(fitsfile *infits,FILE *out,FitsHdu *hduptr)

{
  test_ext(infits,out,hduptr);
  if ((hduptr->pcount != -99) && (hduptr->pcount != 0)) {
    sprintf(errmes,"Illegal pcount value %ld for image ext.");
    infits = (fitsfile *)out;
    wrterr(out,errmes,1);
  }
  if ((hduptr->gcount != -99) && (hduptr->gcount != 1)) {
    sprintf(errmes,"Illegal gcount value %d for image ext.");
    infits = (fitsfile *)out;
    wrterr(out,errmes,1);
  }
  test_array(infits,out,hduptr);
  return;
}

Assistant:

void test_img_ext(fitsfile *infits, 	/* input fits file   */ 
	     FILE*     out,	/* output ascii file */
	     FitsHdu  *hduptr	/* information about header */
            )
{
    test_ext(infits,out,hduptr);
    
    /* The XTENSION, BITPIX, NAXIS, and NAXISn keywords  have been 
       checked in CFITSIO */

    if(hduptr->pcount != 0 && hduptr->pcount != -99){
        sprintf(errmes,
           "Illegal pcount value %ld for image ext.",(long) hduptr->pcount);
        wrterr(out,errmes,1);
    }

    if(hduptr->gcount !=1 && hduptr->gcount != -99){
        sprintf(errmes,
           "Illegal gcount value %d for image ext.",hduptr->gcount);
        wrterr(out,errmes,1);
    }

    test_array(infits, out, hduptr);
    
    return ;
}